

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

parameter_trie_ptr __thiscall
boost::runtime::cla::rt_cla_detail::parameter_trie::make_subtrie(parameter_trie *this,char c)

{
  bool bVar1;
  parameter_trie *p;
  shared_count extraout_RDX;
  map<char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::less<char>,_std::allocator<std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>_>
  *in_RSI;
  element_type *in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<char,_shared_ptr<parameter_trie>_>_>::value,_pair<iterator,_bool>_>
  _Var2;
  parameter_trie_ptr pVar3;
  const_iterator it;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  _Rb_tree_iterator<std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
  in_stack_ffffffffffffff30;
  pair<char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_> *__x;
  element_type *this_00;
  pair<char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_> local_78;
  iterator local_50;
  undefined1 local_48;
  _Rb_tree_const_iterator<std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
  local_40;
  iterator local_38;
  _Rb_tree_const_iterator<std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
  local_30;
  iterator local_28;
  _Rb_tree_const_iterator<std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
  local_20 [4];
  
  this_00 = in_RDI;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::less<char>,_std::allocator<std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>_>
       ::find((map<char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::less<char>,_std::allocator<std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>_>
               *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
              (key_type_conflict *)0x29a6c7);
  std::
  _Rb_tree_const_iterator<std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
  ::_Rb_tree_const_iterator(local_20,&local_28);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::less<char>,_std::allocator<std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>_>
       ::end((map<char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::less<char>,_std::allocator<std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>_>
              *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  std::
  _Rb_tree_const_iterator<std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
  ::_Rb_tree_const_iterator(&local_30,&local_38);
  bVar1 = std::operator==(local_20,&local_30);
  if (bVar1) {
    p = (parameter_trie *)operator_new(0x60);
    parameter_trie((parameter_trie *)in_stack_ffffffffffffff30._M_node);
    __x = &local_78;
    shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::
    shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>
              ((shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *)this_00,p);
    std::make_pair<char&,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>
              (&__x->first,
               (shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *)
               in_stack_ffffffffffffff30._M_node);
    _Var2 = std::
            map<char,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,std::less<char>,std::allocator<std::pair<char_const,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>>
            ::
            insert<std::pair<char,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>
                      (in_RSI,__x);
    in_stack_ffffffffffffff30 = _Var2.first._M_node;
    in_stack_ffffffffffffff2f = _Var2.second;
    local_50._M_node = in_stack_ffffffffffffff30._M_node;
    local_48 = in_stack_ffffffffffffff2f;
    std::
    _Rb_tree_const_iterator<std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
    ::_Rb_tree_const_iterator(&local_40,&local_50);
    local_20[0]._M_node = local_40._M_node;
    std::pair<char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>::~pair
              ((pair<char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_> *
               )0x29a7ef);
    shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::~shared_ptr
              ((shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *)0x29a7f9);
  }
  std::
  _Rb_tree_const_iterator<std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
  ::operator->((_Rb_tree_const_iterator<std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                *)0x29a85b);
  shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::shared_ptr
            ((shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *)
             in_stack_ffffffffffffff30._M_node,
             (shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *)
             CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  pVar3.pn.pi_ = extraout_RDX.pi_;
  pVar3.px = in_RDI;
  return pVar3;
}

Assistant:

parameter_trie_ptr  make_subtrie( char c )
    {
        trie_per_char::const_iterator it = m_subtrie.find( c );

        if( it == m_subtrie.end() )
            it = m_subtrie.insert( std::make_pair( c, parameter_trie_ptr( new parameter_trie ) ) ).first;

        return it->second;
    }